

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

void __thiscall cppcms::crypto::hmac::hmac(hmac *this,string *name,key *k)

{
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  *puVar1;
  message_digest *pmVar2;
  int iVar3;
  undefined4 extraout_var;
  invalid_argument *this_00;
  string *ctx;
  _Alloc_hider _Var4;
  string local_50;
  
  puVar1 = &this->md_;
  (this->d).ptr_ = (data_ *)0x0;
  (this->md_)._M_t.
  super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
  .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl =
       (message_digest *)0x0;
  (this->md_opad_)._M_t.
  super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
  .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl =
       (message_digest *)0x0;
  crypto::key::key(&this->key_,k);
  ctx = name;
  message_digest::create_by_name(&local_50);
  _Var4._M_p = local_50._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)0x0;
  pmVar2 = (puVar1->_M_t).
           super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
           .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
  (puVar1->_M_t).
  super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
  .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl =
       (message_digest *)_Var4._M_p;
  if (pmVar2 != (message_digest *)0x0) {
    (*pmVar2->_vptr_message_digest[1])(pmVar2);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
    _Var4._M_p = (pointer)(puVar1->_M_t).
                          super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
                          .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>.
                          _M_head_impl;
  }
  if ((message_digest *)_Var4._M_p != (message_digest *)0x0) {
    iVar3 = (*((message_digest *)_Var4._M_p)->_vptr_message_digest[6])();
    pmVar2 = (this->md_opad_)._M_t.
             super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
             .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
    (this->md_opad_)._M_t.
    super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
    ._M_t.
    super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
    .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl =
         (message_digest *)CONCAT44(extraout_var,iVar3);
    if (pmVar2 != (message_digest *)0x0) {
      (*pmVar2->_vptr_message_digest[1])();
    }
    init(this,(EVP_PKEY_CTX *)ctx);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x30);
  std::operator+(&local_50,"Invalid or unsupported hash function:",name);
  booster::invalid_argument::invalid_argument(this_00,&local_50);
  __cxa_throw(this_00,&booster::invalid_argument::typeinfo,
              booster::invalid_argument::~invalid_argument);
}

Assistant:

hmac::hmac(std::string const &name,key const &k) : key_(k)
	{
		md_ = message_digest::create_by_name(name);
		if(!md_.get()) {
			throw booster::invalid_argument("Invalid or unsupported hash function:" + name);
		}
		md_opad_.reset(md_->clone());
		init();
	}